

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O0

void __thiscall
Js::NumberFormatPartsBuilder::InsertPart
          (NumberFormatPartsBuilder *this,UNumberFormatFields field,int start,int end)

{
  UNumberFormatFields UVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  UNumberFormatFields **ppUVar5;
  uint local_30;
  charcount_t i;
  UNumberFormatFields parentEndField;
  UNumberFormatFields parentStartField;
  charcount_t ccEnd;
  charcount_t ccStart;
  int end_local;
  int start_local;
  UNumberFormatFields field_local;
  NumberFormatPartsBuilder *this_local;
  
  if (start < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x917,"(start >= 0)","start >= 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (end <= start) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x918,"(start < end)","start < end");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (this->formattedLength < (uint)end) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x91e,"(ccEnd <= formattedLength)","ccEnd <= formattedLength");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ppUVar5 = Memory::WriteBarrierPtr::operator_cast_to_UNumberFormatFields__
                      ((WriteBarrierPtr *)&this->fields);
  UVar1 = (*ppUVar5)[(uint)start];
  ppUVar5 = Memory::WriteBarrierPtr::operator_cast_to_UNumberFormatFields__
                      ((WriteBarrierPtr *)&this->fields);
  local_30 = start;
  if (UVar1 != (*ppUVar5)[end - 1]) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x925,"(parentStartField == parentEndField)",
                                "parentStartField == parentEndField");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  for (; local_30 < (uint)end; local_30 = local_30 + 1) {
    ppUVar5 = Memory::WriteBarrierPtr::operator_cast_to_UNumberFormatFields__
                        ((WriteBarrierPtr *)&this->fields);
    if ((*ppUVar5)[local_30] == UVar1) {
      ppUVar5 = Memory::WriteBarrierPtr::operator_cast_to_UNumberFormatFields__
                          ((WriteBarrierPtr *)&this->fields);
      (*ppUVar5)[local_30] = field;
    }
  }
  return;
}

Assistant:

void InsertPart(UNumberFormatFields field, int start, int end)
        {
            AssertOrFailFast(start >= 0);
            AssertOrFailFast(start < end);

            // the asserts above mean the cast to charcount_t is safe
            charcount_t ccStart = static_cast<charcount_t>(start);
            charcount_t ccEnd = static_cast<charcount_t>(end);

            AssertOrFailFast(ccEnd <= formattedLength);

            // Make sure that the part does not overlap/is a strict subset or superset of other fields
            // The part builder could probably be built and tested to handle this structure not being so rigid,
            // but its safer for now to make sure this is true.
            UNumberFormatFields parentStartField = fields[ccStart];
            UNumberFormatFields parentEndField = fields[ccEnd - 1];
            AssertOrFailFast(parentStartField == parentEndField);

            // Actually insert the part now
            // Only overwrite fields in the span that match start and end, since fields that don't match are sub-parts that were already inserted
            for (charcount_t i = ccStart; i < ccEnd; ++i)
            {
                if (fields[i] == parentStartField)
                {
                    fields[i] = field;
                }
            }
        }